

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O0

int circ_buf_write(Solution *val)

{
  int iVar1;
  int *piVar2;
  Solution *val_local;
  
  iVar1 = sem_wait((sem_t *)free_sem);
  if (iVar1 == 0) {
    iVar1 = sem_wait((sem_t *)write_sem);
    if (iVar1 == 0) {
      memcpy(buf->values + buf->writePosition,val,0x44);
      buf->writePosition = (buf->writePosition + 1) % 5;
      iVar1 = sem_post((sem_t *)write_sem);
      if (iVar1 == 0) {
        iVar1 = sem_post((sem_t *)used_sem);
        if (iVar1 == 0) {
          val_local._4_4_ = 0;
        }
        else {
          val_local._4_4_ = -1;
        }
      }
      else {
        val_local._4_4_ = -1;
      }
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 4) {
        val_local._4_4_ = 1;
      }
      else {
        val_local._4_4_ = -1;
      }
    }
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 4) {
      val_local._4_4_ = 1;
    }
    else {
      val_local._4_4_ = -1;
    }
  }
  return val_local._4_4_;
}

Assistant:

int circ_buf_write(const Solution *val)
{

    if (sem_wait(free_sem) != 0)
    { 
        if(errno==EINTR)
            return 1;
        else
            return -1;
    }

    if (sem_wait(write_sem) != 0)
    {
        if(errno==EINTR)
            return 1;
        else
            return -1;
    }

    buf->values[buf->writePosition] = *val;
    buf->writePosition = (buf->writePosition + 1) % BUFFERLENGTH;

    if (sem_post(write_sem) != 0)
    {
        return -1;
    }

    if (sem_post(used_sem) != 0)
    {
        return -1;
    }
    return 0;
}